

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * __thiscall cs_impl::any::get_ext(any *this)

{
  string *str;
  namespace_t *pnVar1;
  long *in_RDI;
  runtime_error *this_00;
  undefined1 local_29 [41];
  
  if (*in_RDI == 0) {
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (runtime_error *)local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_29 + 1),"Type doesn\'t have extension field.",(allocator *)this_00);
    cs::runtime_error::runtime_error(this_00,str);
    __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  pnVar1 = (namespace_t *)(**(code **)(**(long **)(*in_RDI + 0x10) + 0x50))();
  return pnVar1;
}

Assistant:

cs::namespace_t &get_ext() const
		{
			if (this->mDat == nullptr)
				throw cs::runtime_error("Type doesn't have extension field.");
			return this->mDat->data->get_ext();
		}